

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckConcatenation(Configuration *state,string *sql_statement,bool *print_statement)

{
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"\\|\\|",0x10);
  std::__cxx11::string::string((string *)&title,"String Concatenation",&local_a9);
  std::__cxx11::string::string((string *)&local_48,(string *)&title);
  std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a98d4,&local_a9);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,
               &local_48,&local_68,true,0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&title);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckConcatenation(Configuration& state,
                        const std::string& sql_statement,
                        bool& print_statement) {


  std::regex pattern("\\|\\|");
  std::string title = "String Concatenation";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Use COALESCE for string concatenation of nullable columns:  "
      "You may need to force a column or expression to be non-null for the sake of "
      "simplifying the query logic, but you don't want that value to be stored. "
      "Use COALESCE function to construct the concatenated expression so that a "
      "null-valued column doesn't make the whole expression become null. "
      "EX: SELECT first_name || COALESCE(' ' || middle_initial || ' ', ' ') || last_name "
      "AS full_name FROM Accounts;";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}